

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uset.cpp
# Opt level: O2

UBool uset_getSerializedSet_63(USerializedSet *fillSet,uint16_t *src,int32_t srcLength)

{
  ushort uVar1;
  UBool UVar2;
  uint uVar3;
  uint uVar4;
  uint16_t *puVar5;
  
  if (fillSet == (USerializedSet *)0x0) {
    return '\0';
  }
  if (src == (uint16_t *)0x0 || srcLength < 1) {
LAB_002bef79:
    fillSet->bmpLength = 0;
    uVar4 = 0;
    UVar2 = '\0';
  }
  else {
    uVar1 = *src;
    uVar4 = (uint)uVar1;
    uVar3 = (uint)uVar1;
    if ((short)uVar1 < 0) {
      uVar4 = uVar3 & 0x7fff;
      if ((uint)srcLength < uVar4 + 2) goto LAB_002bef79;
      puVar5 = src + 2;
      fillSet->bmpLength = (uint)src[1];
    }
    else {
      if ((uint)srcLength <= uVar3) goto LAB_002bef79;
      puVar5 = src + 1;
      fillSet->bmpLength = uVar3;
    }
    fillSet->array = puVar5;
    UVar2 = '\x01';
  }
  fillSet->length = uVar4;
  return UVar2;
}

Assistant:

U_CAPI UBool U_EXPORT2
uset_getSerializedSet(USerializedSet* fillSet, const uint16_t* src, int32_t srcLength) {
    int32_t length;

    if(fillSet==NULL) {
        return FALSE;
    }
    if(src==NULL || srcLength<=0) {
        fillSet->length=fillSet->bmpLength=0;
        return FALSE;
    }

    length=*src++;
    if(length&0x8000) {
        /* there are supplementary values */
        length&=0x7fff;
        if(srcLength<(2+length)) {
            fillSet->length=fillSet->bmpLength=0;
            return FALSE;
        }
        fillSet->bmpLength=*src++;
    } else {
        /* only BMP values */
        if(srcLength<(1+length)) {
            fillSet->length=fillSet->bmpLength=0;
            return FALSE;
        }
        fillSet->bmpLength=length;
    }
    fillSet->array=src;
    fillSet->length=length;
    return TRUE;
}